

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O2

bool __thiscall HACD::ICHUll::FindMaxVolumePoint(ICHUll *this)

{
  double dVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  CircularListElement<HACD::TMMVertex> *pCVar7;
  CircularListElement<HACD::TMMVertex> *pCVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double volume;
  double local_30;
  double local_28;
  
  pCVar7 = (this->m_mesh).m_vertices.m_head;
  pCVar8 = (CircularListElement<HACD::TMMVertex> *)0x0;
  local_30 = 0.0;
  pCVar2 = pCVar7->m_prev;
  local_28 = 0.0;
  while ((pCVar7->m_data).m_tag == false) {
    bVar6 = ComputePointVolume(this,&local_28,false);
    pCVar7 = (this->m_mesh).m_vertices.m_head;
    if (bVar6) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_28;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_30;
      auVar9 = vmaxsd_avx(auVar9,auVar10);
      if (local_30 < local_28) {
        pCVar8 = pCVar7;
      }
      local_30 = auVar9._0_8_;
      if ((this->m_mesh).m_vertices.m_size != 0) {
        pCVar7 = pCVar7->m_next;
        (this->m_mesh).m_vertices.m_head = pCVar7;
      }
    }
  }
  pCVar7 = pCVar2->m_next;
  (this->m_mesh).m_vertices.m_head = pCVar7;
  if ((pCVar8 != (CircularListElement<HACD::TMMVertex> *)0x0) && (pCVar8 != pCVar7)) {
    dVar1 = (pCVar7->m_data).m_pos.m_data[2];
    lVar3 = (pCVar7->m_data).m_name;
    dVar4 = (pCVar7->m_data).m_pos.m_data[0];
    dVar5 = (pCVar7->m_data).m_pos.m_data[1];
    (pCVar7->m_data).m_pos.m_data[0] = (pCVar8->m_data).m_pos.m_data[0];
    (pCVar7->m_data).m_pos.m_data[1] = (pCVar8->m_data).m_pos.m_data[1];
    (pCVar7->m_data).m_pos.m_data[2] = (pCVar8->m_data).m_pos.m_data[2];
    (pCVar8->m_data).m_pos.m_data[0] = dVar4;
    (pCVar8->m_data).m_pos.m_data[1] = dVar5;
    (pCVar8->m_data).m_pos.m_data[2] = dVar1;
    (pCVar7->m_data).m_name = lVar3;
  }
  return pCVar8 != (CircularListElement<HACD::TMMVertex> *)0x0;
}

Assistant:

bool ICHUll::FindMaxVolumePoint()
	{
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * vMaxVolume = 0;
        CircularListElement<TMMVertex> * vHeadPrev = vertices.GetHead()->GetPrev();
        
        double maxVolume = 0.0;
        double volume = 0.0;
        
        while (!vertices.GetData().m_tag) // not processed
        {
            if (ComputePointVolume(volume, false))
            {
                if ( maxVolume < volume)
                {
                    maxVolume = volume;
                    vMaxVolume = vertices.GetHead();
                }
                vertices.Next();
            }
        }
        CircularListElement<TMMVertex> * vHead = vHeadPrev->GetNext();
        vertices.GetHead() = vHead;  
        
        if (!vMaxVolume)
        {
            return false;
        }
        
        if (vMaxVolume != vHead)
        {
            Vec3<Real> pos = vHead->GetData().m_pos;
            long id = vHead->GetData().m_name;
            vHead->GetData().m_pos = vMaxVolume->GetData().m_pos;
            vHead->GetData().m_name = vMaxVolume->GetData().m_name;
            vMaxVolume->GetData().m_pos = pos;
            vHead->GetData().m_name = id;
        }
        
 
        return true;
    }